

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void kj::(anonymous_namespace)::expectRes<kj::String,char,4ul>
               (EncodingResult<kj::String> *result,char (*expected) [4],bool errors)

{
  char *pcVar1;
  size_t sVar2;
  bool in_R8B;
  ArrayPtr<const_char> expected_00;
  char *local_28;
  size_t sStack_20;
  ArrayDisposer *local_18;
  undefined1 local_10;
  
  expected_00.size_ = (ulong)expected & 0xffffffff;
  local_28 = (result->super_String).content.ptr;
  sStack_20 = (result->super_String).content.size_;
  local_18 = (result->super_String).content.disposer;
  (result->super_String).content.ptr = (char *)0x0;
  (result->super_String).content.size_ = 0;
  local_10 = result->hadErrors;
  expected_00.ptr = (char *)0x3;
  expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&local_28,(EncodingResult<kj::String> *)0x3a5188,expected_00,
             in_R8B);
  sVar2 = sStack_20;
  pcVar1 = local_28;
  if (local_28 != (char *)0x0) {
    local_28 = (char *)0x0;
    sStack_20 = 0;
    (**local_18->_vptr_ArrayDisposer)(local_18,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}